

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  bool bVar1;
  char value;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  iterator pcVar7;
  iterator pcVar8;
  bool local_2f3;
  byte local_2f2;
  bool local_2f1;
  bool local_299;
  char local_289;
  Twine local_288;
  bool local_269;
  undefined1 auStack_268 [7];
  bool component_has_sep;
  StringRef c_1;
  size_t loc;
  bool path_has_sep;
  StringRef *component;
  iterator __end2;
  iterator __begin2;
  SmallVector<llvm::StringRef,_4U> *__range2;
  StringRef local_208;
  StringRef local_1f8;
  StringRef local_1e8;
  undefined1 local_1d8 [8];
  SmallVector<llvm::StringRef,_4U> components;
  SmallString<32U> d_storage;
  SmallString<32U> c_storage;
  SmallString<32U> b_storage;
  SmallString<32U> a_storage;
  Twine *d_local;
  Twine *c_local;
  Twine *b_local;
  Twine *a_local;
  Style style_local;
  SmallVectorImpl<char> *path_local;
  unsigned_long local_88 [2];
  size_type local_78;
  iterator local_70;
  undefined1 local_68 [16];
  iterator local_58;
  SmallVectorBase *local_50;
  SmallVectorBase *local_48;
  SmallVectorBase *local_40;
  ulong local_38;
  SmallVectorImpl<char> *local_30;
  SmallVectorImpl<char> *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             + 0x18));
  SmallString<32U>::SmallString
            ((SmallString<32U> *)
             (components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
              super_AlignedCharArray<8UL,_16UL>.buffer + 8));
  SmallVector<llvm::StringRef,_4U>::SmallVector((SmallVector<llvm::StringRef,_4U> *)local_1d8);
  bVar1 = Twine::isTriviallyEmpty(a);
  if (!bVar1) {
    local_1e8 = Twine::toStringRef(a,(SmallVectorImpl<char> *)
                                     (b_storage.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_1d8,&local_1e8);
  }
  bVar1 = Twine::isTriviallyEmpty(b);
  if (!bVar1) {
    local_1f8 = Twine::toStringRef(b,(SmallVectorImpl<char> *)
                                     (c_storage.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_1d8,&local_1f8);
  }
  bVar1 = Twine::isTriviallyEmpty(c);
  if (!bVar1) {
    local_208 = Twine::toStringRef(c,(SmallVectorImpl<char> *)
                                     (d_storage.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_1d8,&local_208);
  }
  bVar1 = Twine::isTriviallyEmpty(d);
  if (!bVar1) {
    ___range2 = Twine::toStringRef(d,(SmallVectorImpl<char> *)
                                     (components.super_SmallVectorStorage<llvm::StringRef,_4U>.
                                      InlineElts[3].super_AlignedCharArray<8UL,_16UL>.buffer + 8));
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_1d8,(StringRef *)&__range2);
  }
  local_50 = (SmallVectorBase *)local_1d8;
  __end2 = (iterator)local_1d8;
  local_48 = local_50;
  local_40 = local_50;
  sVar2 = SmallVectorBase::size(local_50);
  do {
    if (__end2 == (iterator)((long)local_1d8 + sVar2 * 0x10)) {
      SmallVector<llvm::StringRef,_4U>::~SmallVector((SmallVector<llvm::StringRef,_4U> *)local_1d8);
      SmallString<32U>::~SmallString
                ((SmallString<32U> *)
                 (components.super_SmallVectorStorage<llvm::StringRef,_4U>.InlineElts[3].
                  super_AlignedCharArray<8UL,_16UL>.buffer + 8));
      SmallString<32U>::~SmallString
                ((SmallString<32U> *)
                 (d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallString<32U>::~SmallString
                ((SmallString<32U> *)
                 (c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      SmallString<32U>::~SmallString
                ((SmallString<32U> *)
                 (b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                  InlineElts + 0x18));
      return;
    }
    bVar1 = SmallVectorBase::empty((SmallVectorBase *)path);
    local_299 = false;
    if (!bVar1) {
      sVar3 = SmallVectorBase::size((SmallVectorBase *)path);
      local_38 = sVar3 - 1;
      local_30 = path;
      sVar4 = SmallVectorBase::size((SmallVectorBase *)path);
      if (sVar4 <= sVar3 - 1) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      local_28 = path;
      local_299 = is_separator(*(char *)((long)(path->super_SmallVectorTemplateBase<char,_true>).
                                               super_SmallVectorTemplateCommon<char,_void>.
                                               super_SmallVectorBase.BeginX + local_38),style);
    }
    if (local_299 == false) {
      local_58 = __end2;
      local_2f1 = false;
      if (__end2->Length != 0) {
        value = StringRef::operator[](__end2,0);
        local_2f1 = is_separator(value,style);
      }
      local_269 = local_2f1;
      local_2f2 = 0;
      if (local_2f1 == false) {
        bVar1 = SmallVectorBase::empty((SmallVectorBase *)path);
        local_2f3 = true;
        if (!bVar1) {
          Twine::Twine(&local_288,__end2);
          local_2f3 = has_root_name(&local_288,style);
        }
        local_2f2 = local_2f3 ^ 0xff;
      }
      if ((local_2f2 & 1) != 0) {
        local_289 = anon_unknown.dwarf_8c700::preferred_separator(style);
        SmallVectorTemplateBase<char,_true>::push_back
                  (&path->super_SmallVectorTemplateBase<char,_true>,&local_289);
      }
      pcVar7 = StringRef::begin(__end2);
      pcVar8 = StringRef::end(__end2);
      SmallVectorImpl<char>::append<char_const*,void>(path,pcVar7,pcVar8);
    }
    else {
      pcVar5 = anon_unknown.dwarf_8c700::separators(style);
      c_1.Length = (size_t)pcVar5;
      if (pcVar5 != (char *)0x0) {
        strlen(pcVar5);
      }
      local_78 = StringRef::find_first_not_of(__end2,stack0xfffffffffffffda8,0);
      local_70 = __end2;
      local_88[1] = 0xffffffffffffffff;
      puVar6 = std::min<unsigned_long>(&local_78,&__end2->Length);
      local_78 = *puVar6;
      pcVar5 = __end2->Data + local_78;
      local_88[0] = __end2->Length - local_78;
      puVar6 = std::min<unsigned_long>(local_88 + 1,local_88);
      c_1.Data = (char *)*puVar6;
      local_10 = local_68;
      _auStack_268 = pcVar5;
      local_20 = c_1.Data;
      local_18 = pcVar5;
      pcVar7 = StringRef::begin((StringRef *)auStack_268);
      pcVar8 = StringRef::end((StringRef *)auStack_268);
      SmallVectorImpl<char>::append<char_const*,void>(path,pcVar7,pcVar8);
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}